

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

bool __thiscall argo::json::operator!=(json *this,string *s)

{
  bool bVar1;
  string *psVar2;
  string local_38 [32];
  string *local_18;
  string *s_local;
  json *this_local;
  
  local_18 = s;
  s_local = (string *)this;
  psVar2 = operator_cast_to_string_(this);
  std::__cxx11::string::string(local_38,(string *)psVar2);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,local_18);
  std::__cxx11::string::~string(local_38);
  return bVar1;
}

Assistant:

bool json::operator!=(const std::string &s) const
{
    return static_cast<string>(*this) != s;
}